

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7243:23)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:7243:23)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<void>_> *pEVar1;
  Status *in;
  Promise<void> local_580;
  ExceptionOr<kj::Promise<void>_> local_578;
  Status *local_3d0;
  Status *depValue;
  Status *_depValue779;
  Exception *local_218;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1f8 [8];
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:7243:23)>
  *this_local;
  
  depResult.value.ptr.field_1.value.errorBody.ptr.ptr = (AsyncInputStream *)output;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status>::ExceptionOr
            ((ExceptionOr<kj::HttpClient::ConnectRequest::Status> *)local_1f8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1f8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1f8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::HttpClient::ConnectRequest::Status>
                         ((Maybe<kj::HttpClient::ConnectRequest::Status> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (Status *)0x0) {
      local_3d0 = depValue;
      in = mv<kj::HttpClient::ConnectRequest::Status>(depValue);
      MaybeVoidCaller<kj::HttpClient::ConnectRequest::Status,kj::Promise<void>>::
      apply<kj::(anonymous_namespace)::TestCase7223::run()::__0>
                ((MaybeVoidCaller<kj::HttpClient::ConnectRequest::Status,kj::Promise<void>> *)
                 &local_580,&this->func,in);
      TransformPromiseNodeBase::handle<kj::Promise<void>>
                (&local_578,&this->super_TransformPromiseNodeBase,&local_580);
      pEVar1 = ExceptionOrValue::as<kj::Promise<void>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.errorBody.ptr.ptr);
      ExceptionOr<kj::Promise<void>_>::operator=(pEVar1,&local_578);
      ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_578);
      Promise<void>::~Promise(&local_580);
    }
  }
  else {
    local_218 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<void>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<void>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<void>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.errorBody.ptr.ptr);
    ExceptionOr<kj::Promise<void>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<void>_> *)&_depValue779);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr((ExceptionOr<kj::Promise<void>_> *)&_depValue779);
  }
  ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr
            ((ExceptionOr<kj::HttpClient::ConnectRequest::Status> *)local_1f8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }